

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::SocketWriter::Send(SocketWriter *this,string *message)

{
  ostream *poVar1;
  size_t sVar2;
  int __fd;
  size_t __n;
  GTestLog local_20;
  GTestLog local_1c;
  
  __fd = this->sockfd_;
  if (__fd == -1) {
    GTestLog::GTestLog(&local_1c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/googletest/googletest/src/gtest-internal-inl.h"
                       ,0x42d);
    poVar1 = std::operator<<((ostream *)&std::cerr,"Condition sockfd_ != -1 failed. ");
    std::operator<<(poVar1,"Send() can be called only when there is a connection.");
    GTestLog::~GTestLog(&local_1c);
    __fd = this->sockfd_;
  }
  __n = (size_t)(int)message->_M_string_length;
  sVar2 = write(__fd,(message->_M_dataplus)._M_p,__n);
  if (sVar2 != __n) {
    GTestLog::GTestLog(&local_20,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/googletest/googletest/src/gtest-internal-inl.h"
                       ,0x432);
    poVar1 = std::operator<<((ostream *)&std::cerr,"stream_result_to: failed to stream to ");
    poVar1 = std::operator<<(poVar1,(string *)&this->host_name_);
    poVar1 = std::operator<<(poVar1,":");
    std::operator<<(poVar1,(string *)&this->port_num_);
    GTestLog::~GTestLog(&local_20);
  }
  return;
}

Assistant:

virtual void Send(const string& message) {
      GTEST_CHECK_(sockfd_ != -1)
          << "Send() can be called only when there is a connection.";

      const int len = static_cast<int>(message.length());
      if (write(sockfd_, message.c_str(), len) != len) {
        GTEST_LOG_(WARNING)
            << "stream_result_to: failed to stream to "
            << host_name_ << ":" << port_num_;
      }
    }